

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

void __thiscall Highs::deleteColsInterface(Highs *this,HighsIndexCollection *index_collection)

{
  reference pvVar1;
  vector<double,_std::allocator<double>_> *in_RSI;
  HighsIndexCollection *in_RDI;
  HighsInt col;
  HighsInt new_col;
  HighsInt original_num_col;
  HighsBasis *basis;
  HighsLp *lp;
  HighsIndexCollection *in_stack_00000098;
  HighsHessian *in_stack_000000a0;
  HighsIndexCollection *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar2;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer *this_00;
  HighsIndexCollection *index_collection_00;
  
  index_collection_00 =
       (HighsIndexCollection *)
       &in_RDI[3].mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  this_00 = &in_RDI[1].set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  HighsLp::ensureColwise((HighsLp *)0x4da6aa);
  iVar5 = index_collection_00->dimension_;
  HighsLp::deleteCols((HighsLp *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_RDI);
  HighsHessian::deleteCols(in_stack_000000a0,in_stack_00000098);
  if (index_collection_00->dimension_ != iVar5) {
    *(undefined4 *)
     ((long)&in_RDI[0x3a].set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish + 4) = 0;
    if (((ulong)in_RDI[1].set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish & 0x10000) != 0) {
      deleteBasisCols((HighsBasis *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffb8,0);
    }
    if (((ulong)index_collection_00[6].set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage & 0x100000000) != 0) {
      deleteScale(in_RSI,index_collection_00);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)this_00,
                 CONCAT44(iVar5,in_stack_ffffffffffffffd8));
      *(HighsInt *)&index_collection_00[6].is_mask_ = index_collection_00->dimension_;
    }
    invalidateModelStatusSolutionAndInfo
              ((Highs *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    HEkk::deleteCols((HEkk *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
    if (((ulong)in_RSI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start & 1) != 0) {
      iVar3 = 0;
      for (iVar2 = 0; iVar2 < iVar5; iVar2 = iVar2 + 1) {
        pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &in_RSI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,(long)iVar2);
        if (*pvVar1 == 0) {
          iVar4 = iVar3;
          pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              &in_RSI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_finish,(long)iVar2);
          *pvVar1 = iVar3;
          iVar3 = iVar4 + 1;
        }
        else {
          pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              &in_RSI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_finish,(long)iVar2);
          *pvVar1 = -1;
        }
      }
    }
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::clear((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *)0x4da844);
  }
  return;
}

Assistant:

void Highs::deleteColsInterface(HighsIndexCollection& index_collection) {
  HighsLp& lp = model_.lp_;
  HighsBasis& basis = basis_;
  lp.ensureColwise();

  // Keep a copy of the original number of columns to check whether
  // any columns have been removed, and if there is mask to be updated
  HighsInt original_num_col = lp.num_col_;

  lp.deleteCols(index_collection);
  model_.hessian_.deleteCols(index_collection);
  // Bail out if no columns were actually deleted
  if (lp.num_col_ == original_num_col) return;

  assert(lp.num_col_ < original_num_col);

  // Nontrivial deletion so reset the model_status and update any
  // Highs basis
  model_status_ = HighsModelStatus::kNotset;
  if (basis_.useful) {
    assert(basis_.col_status.size() == static_cast<size_t>(original_num_col));
    // Have a full set of column basis status values, so maintain
    // them, and only invalidate the basis if a basic column has been
    // deleted
    deleteBasisCols(basis_, index_collection, original_num_col);
  } else {
    assert(!basis.valid);
  }

  if (lp.scale_.has_scaling) {
    deleteScale(lp.scale_.col, index_collection);
    lp.scale_.col.resize(lp.num_col_);
    lp.scale_.num_col = lp.num_col_;
  }
  // Deduce the consequences of deleting columns
  invalidateModelStatusSolutionAndInfo();

  // Determine any implications for simplex data
  ekk_instance_.deleteCols(index_collection);

  if (index_collection.is_mask_) {
    // Set the mask values to indicate the new index value of the
    // remaining columns
    HighsInt new_col = 0;
    for (HighsInt col = 0; col < original_num_col; col++) {
      if (!index_collection.mask_[col]) {
        index_collection.mask_[col] = new_col;
        new_col++;
      } else {
        index_collection.mask_[col] = -1;
      }
    }
    assert(new_col == lp.num_col_);
  }
  assert(lpDimensionsOk("deleteCols", lp, options_.log_options));
  lp.col_hash_.name2index.clear();
}